

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status fdb_iterator_next(fdb_iterator *iterator)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_char> *paVar2;
  uint64_t *value_buf;
  wal_item_action wVar3;
  docio_handle *handle;
  snap_handle *shandle;
  fdb_status fVar4;
  int iVar5;
  hbtrie_result hVar6;
  wal_item *pwVar7;
  int64_t iVar8;
  char cVar9;
  byte bVar10;
  ulong uVar11;
  btree_result bVar12;
  fdb_status fVar13;
  void *key_buf;
  size_t sVar14;
  bool bVar15;
  uint64_t offset;
  fdb_seqnum_t seqnum;
  uint64_t hboffset;
  int64_t _offset;
  fdb_kvs_id_t kv_id;
  fdb_doc doc_kv;
  size_t seq_kv_len;
  ulong local_150;
  ulong local_148;
  uint64_t local_140;
  docio_object local_138;
  docio_handle *local_100;
  size_t *local_f8;
  ulong local_f0;
  uint64_t local_e8;
  fdb_kvs_id_t local_e0;
  fdb_doc local_d8;
  undefined1 local_88 [8];
  ulong local_80;
  docio_object local_78;
  size_t local_38;
  
  if (iterator == (fdb_iterator *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (iterator->handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  paVar2 = &iterator->handle->handle_busy;
  LOCK();
  bVar15 = (paVar2->super___atomic_base<unsigned_char>)._M_i == '\0';
  if (bVar15) {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\x01';
  }
  UNLOCK();
  fVar13 = FDB_RESULT_HANDLE_BUSY;
  if (!bVar15) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
LAB_0012f2e1:
    local_150 = 0xffffffffffffffff;
    local_138.length.keylen = 0;
    local_138.length.metalen = 0;
    local_138.length.bodylen = 0;
    local_138.length.bodylen_ondisk = 0;
    local_138.length.flag = '\0';
    local_138.length.checksum = '\0';
    local_138.length.reserved = 0;
    local_138.timestamp = 0;
    local_138.meta = (void *)0x0;
    local_138.body = (void *)0x0;
    local_138.key = (void *)0x0;
    local_138.field_3.seqnum = 0;
    if (iterator->direction != '\x01') {
      if (iterator->status == '\0') {
        iterator->_offset = 0xffffffffffffffff;
      }
      if (iterator->tree_cursor_prev != (wal_item *)0x0) {
        pwVar7 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor_prev);
        iterator->tree_cursor = pwVar7;
        iterator->status = '\0';
      }
    }
    bVar12 = BTREE_RESULT_FAIL;
    while( true ) {
      local_148 = iterator->_seqnum;
      handle = iterator->handle->dhandle;
      if (iterator->_offset == 0xffffffffffffffff) break;
LAB_0012f42b:
      if (bVar12 == BTREE_RESULT_FAIL) {
        if (iterator->tree_cursor == (wal_item *)0x0) goto LAB_0012f797;
        do {
          if (iterator->tree_cursor == (wal_item *)0x0) goto LAB_0012f4fb;
          if (iterator->status == '\x01') {
            iterator->tree_cursor_prev = iterator->tree_cursor;
            pwVar7 = wal_itr_next(iterator->wal_itr);
            iterator->tree_cursor = pwVar7;
            if (pwVar7 == (wal_item *)0x0) goto LAB_0012f797;
          }
          iterator->status = '\x01';
          pwVar7 = iterator->tree_cursor;
          if (pwVar7->action == '\x01') {
            bVar10 = ((byte)iterator->opt & 2) >> 1;
          }
          else {
            bVar10 = 0;
          }
          if (((iterator->opt & 1) == 0) && (pwVar7->action == '\x02' || bVar10 != 0)) {
            cVar9 = (pwVar7 != (wal_item *)0x0) * '\x02' + '\x01';
            if (pwVar7 == (wal_item *)0x0) {
              fVar13 = FDB_RESULT_ITERATOR_FAIL;
            }
          }
          else {
            uVar11 = pwVar7->seqnum;
            cVar9 = '\x03';
            if (iterator->_seqnum <= uVar11) {
              if ((iterator->field_12).end_seqnum < uVar11) {
                fVar13 = FDB_RESULT_ITERATOR_FAIL;
                cVar9 = '\x01';
              }
              else {
                local_150 = pwVar7->offset;
                iterator->_offset = local_150;
                iterator->_seqnum = uVar11;
                cVar9 = '\x04';
              }
            }
          }
        } while (cVar9 == '\x03');
        if (cVar9 != '\x04') goto LAB_0012f79d;
      }
LAB_0012f4fb:
      if ((bVar12 != BTREE_RESULT_SUCCESS) || ((iterator->opt & 1) != 0)) goto LAB_0012f77f;
      local_138.key = (void *)0x0;
      local_138.length._0_8_ = local_138.length._0_8_ & 0xffffffffffff0000;
      local_138.meta = (void *)0x0;
      local_138.body = (void *)0x0;
      local_e8 = docio_read_doc_key_meta(handle,local_150,&local_138,true);
      if ((long)local_e8 < 1) {
        fVar13 = (fdb_status)local_e8;
        if (local_e8 == 0) {
          fVar13 = FDB_RESULT_KEY_NOT_FOUND;
        }
        iVar5 = 1;
      }
      else if (((local_138.length._8_8_ & 0x400000000) == 0) || ((iterator->opt & 2) == 0)) {
        local_d8.key = local_138.key;
        local_d8.keylen = local_138.length._0_8_ & 0xffff;
        local_d8.seqnum = 0xffffffffffffffff;
        shandle = iterator->handle->shandle;
        fVar4 = wal_find(shandle->snap_txn,iterator->handle->file,&shandle->cmp_info,shandle,
                         &local_d8,&local_e8);
        if ((fVar4 == FDB_RESULT_SUCCESS) &&
           (((void *)(iterator->field_10).start_seqnum <= local_d8.seqnum &&
            (local_d8.seqnum <= (void *)(iterator->field_12).end_seqnum)))) {
          free(local_138.key);
          free(local_138.meta);
          iVar5 = 2;
        }
        else {
          local_78.length.keylen = 0;
          local_78.length.metalen = 0;
          local_78.length.bodylen = 0;
          local_78.length.bodylen_ondisk = 0;
          local_78.length.flag = '\0';
          local_78.length.checksum = '\0';
          local_78.length.reserved = 0;
          local_78.timestamp = 0;
          local_78.meta = (void *)0x0;
          local_78.body = (void *)0x0;
          local_78.key = (void *)0x0;
          local_78.field_3.seqnum = 0;
          hVar6 = hbtrie_find(iterator->handle->trie,local_138.key,(uint)local_138.length.keylen,
                              &local_f0);
          btreeblk_end(iterator->handle->bhandle);
          iVar5 = 2;
          if (hVar6 == HBTRIE_RESULT_SUCCESS) {
            local_78.key = local_138.key;
            local_f0 = local_f0 >> 0x38 | (local_f0 & 0xff000000000000) >> 0x28 |
                       (local_f0 & 0xff0000000000) >> 0x18 | (local_f0 & 0xff00000000) >> 8 |
                       (local_f0 & 0xff000000) << 8 | (local_f0 & 0xff0000) << 0x18 |
                       (local_f0 & 0xff00) << 0x28 | local_f0 << 0x38;
            local_78.meta = (void *)0x0;
            iVar8 = docio_read_doc_key_meta(iterator->handle->dhandle,local_f0,&local_78,true);
            if (iVar8 < 1) {
              free(local_138.key);
              free(local_138.meta);
              fVar13 = (fdb_status)iVar8;
              if (iVar8 == 0) {
                fVar13 = FDB_RESULT_KEY_NOT_FOUND;
              }
              iVar5 = 1;
              bVar15 = false;
            }
            else if ((local_138.field_3.seqnum < local_78.field_3.seqnum) &&
                    ((ulong)local_78.field_3 <= (iterator->field_12).end_seqnum)) {
              free(local_138.key);
              free(local_138.meta);
              free(local_78.meta);
              iVar5 = 2;
              bVar15 = false;
            }
            else {
              free(local_78.meta);
              iVar5 = 0;
              bVar15 = true;
            }
            if (!bVar15) goto LAB_0012f76d;
            iVar5 = 0;
          }
          free(local_138.key);
          free(local_138.meta);
        }
      }
      else {
        free(local_138.key);
        free(local_138.meta);
        fVar13 = FDB_RESULT_KEY_NOT_FOUND;
        iVar5 = 1;
      }
LAB_0012f76d:
      bVar12 = BTREE_RESULT_SUCCESS;
      if (iVar5 != 2) goto code_r0x0012f77a;
    }
    if (iterator->handle->kvs == (kvs_info *)0x0) {
      bVar12 = btree_next(iterator->seqtree_iterator,&local_148,&local_150);
    }
    else {
      hVar6 = hbtrie_next(iterator->seqtrie_iterator,local_88,&local_38,&local_150);
      bVar12 = BTREE_RESULT_FAIL;
      if (hVar6 == HBTRIE_RESULT_SUCCESS) {
        buf2kvid(8,local_88,&local_e0);
        bVar12 = (uint)(local_e0 != iterator->handle->kvs->id) * 2;
        local_148 = local_80;
      }
    }
    btreeblk_end(iterator->handle->bhandle);
    if (bVar12 != BTREE_RESULT_SUCCESS) goto LAB_0012f42b;
    local_148 = local_148 >> 0x38 | (local_148 & 0xff000000000000) >> 0x28 |
                (local_148 & 0xff0000000000) >> 0x18 | (local_148 & 0xff00000000) >> 8 |
                (local_148 & 0xff000000) << 8 | (local_148 & 0xff0000) << 0x18 |
                (local_148 & 0xff00) << 0x28 | local_148 << 0x38;
    iterator->_seqnum = local_148;
    if (local_148 <= (iterator->field_12).end_seqnum) {
      local_150 = local_150 >> 0x38 | (local_150 & 0xff000000000000) >> 0x28 |
                  (local_150 & 0xff0000000000) >> 0x18 | (local_150 & 0xff00000000) >> 8 |
                  (local_150 & 0xff000000) << 8 | (local_150 & 0xff0000) << 0x18 |
                  (local_150 & 0xff00) << 0x28 | local_150 << 0x38;
      iterator->_offset = 0xffffffffffffffff;
      iterator->status = '\0';
      bVar12 = BTREE_RESULT_SUCCESS;
      goto LAB_0012f42b;
    }
LAB_0012f797:
    fVar13 = FDB_RESULT_ITERATOR_FAIL;
    goto LAB_0012f79d;
  }
  if (iterator->direction != '\x01') {
    iterator->_offset = 0xffffffffffffffff;
    if (iterator->tree_cursor == (wal_item *)0x0) {
      if (iterator->tree_cursor_prev != (wal_item *)0x0) {
        pwVar7 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor_prev);
        iterator->tree_cursor = pwVar7;
        iterator->status = '\0';
      }
    }
    else {
      pwVar7 = wal_itr_search_greater(iterator->wal_itr,iterator->tree_cursor);
      iterator->tree_cursor = pwVar7;
      if ((iterator->direction == '\x02') && (iterator->status != '\x01')) {
        pwVar7 = wal_itr_next(iterator->wal_itr);
        iterator->tree_cursor = pwVar7;
      }
    }
  }
  value_buf = &iterator->_offset;
  local_f8 = &iterator->_keylen;
  hVar6 = HBTRIE_RESULT_SUCCESS;
LAB_0012f7d8:
  do {
    do {
      key_buf = iterator->_key;
      local_100 = iterator->handle->dhandle;
      if (iterator->_offset == 0xffffffffffffffff) {
        local_d8.keylen = 0;
        local_d8.metalen = 0;
        local_d8.bodylen = local_d8.bodylen & 0xffffffff00000000;
        local_d8.seqnum = 0;
        local_d8.offset = 0;
        local_d8.size_ondisk = 0;
        local_d8.key = (void *)0x0;
        do {
          do {
            hVar6 = hbtrie_next(iterator->hbtrie_iterator,key_buf,local_f8,value_buf);
            btreeblk_end(iterator->handle->bhandle);
            uVar11 = iterator->_offset;
            uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                     (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                     (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                     (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
            iterator->_offset = uVar11;
            if (((iterator->opt & 2) == 0) || (hVar6 != HBTRIE_RESULT_SUCCESS)) goto LAB_0012f7f6;
            local_d8.key = (void *)0x0;
            local_d8.seqnum = 0;
            local_d8.bodylen = 0;
            local_d8.size_ondisk = 0;
            local_d8.keylen = 0;
            local_d8.metalen = 0;
            local_d8.offset = 0;
            iVar8 = docio_read_doc_key_meta(local_100,uVar11,(docio_object *)&local_d8,true);
            sVar14 = local_d8.metalen;
          } while (iVar8 < 1);
          free((void *)local_d8.size_ondisk);
          free((void *)local_d8.seqnum);
        } while ((sVar14 & 0x400000000) != 0);
      }
LAB_0012f7f6:
      if (hVar6 == HBTRIE_RESULT_INDEX_CORRUPTED) {
        fVar13 = FDB_RESULT_FILE_CORRUPTION;
        goto LAB_0012fa7a;
      }
      sVar14 = *local_f8;
      local_140 = *value_buf;
      if ((hVar6 != HBTRIE_RESULT_SUCCESS) && (iterator->tree_cursor == (wal_item *)0x0))
      goto LAB_0012fa43;
      do {
        if (iterator->tree_cursor == (wal_item *)0x0) goto LAB_0012f9d8;
        if (iterator->status == '\x01') {
          iterator->tree_cursor_prev = iterator->tree_cursor;
          pwVar7 = wal_itr_next(iterator->wal_itr);
          iterator->tree_cursor = pwVar7;
        }
        pwVar7 = iterator->tree_cursor;
        if (pwVar7 == (wal_item *)0x0) {
          if (hVar6 == HBTRIE_RESULT_SUCCESS) goto LAB_0012f9d8;
          goto LAB_0012fa43;
        }
        iVar5 = -1;
        if (hVar6 == HBTRIE_RESULT_SUCCESS) {
          iVar5 = _fdb_key_cmp(iterator,pwVar7->header->key,(ulong)pwVar7->header->keylen,key_buf,
                               sVar14);
        }
        if (0 < iVar5) goto LAB_0012f9d8;
        wVar3 = pwVar7->action;
        if (wVar3 == '\x01') {
          bVar10 = ((byte)iterator->opt & 2) >> 1;
        }
        else {
          bVar10 = 0;
        }
        iterator->status = '\x01';
        if (iVar5 < 0) {
          iVar5 = 5;
        }
        else {
          *value_buf = 0xffffffffffffffff;
          iVar5 = 2;
        }
        if (wVar3 != '\x02' && bVar10 == 0) {
          local_140 = pwVar7->offset;
          key_buf = pwVar7->header->key;
          sVar14 = (size_t)pwVar7->header->keylen;
          iVar5 = 0;
        }
      } while (iVar5 == 5);
    } while (iVar5 == 2);
LAB_0012f9d8:
    if (local_140 == *value_buf) {
      iterator->_offset = 0xffffffffffffffff;
      iterator->status = '\0';
    }
    if (iterator->start_key == (void *)0x0) break;
    iVar5 = _fdb_key_cmp(iterator,iterator->start_key,(iterator->field_10).start_keylen,key_buf,
                         sVar14);
    if (iVar5 != 0) {
      if (iVar5 < 1) break;
      goto LAB_0012f7d8;
    }
  } while ((iterator->opt & 4) != 0);
  if (iterator->end_key != (void *)0x0) {
    iVar5 = _fdb_key_cmp(iterator,iterator->end_key,(iterator->field_12).end_keylen,key_buf,sVar14);
    if (iVar5 == 0) {
      fVar13 = FDB_RESULT_ITERATOR_FAIL;
      if ((iterator->opt & 8) != 0) goto LAB_0012fa7a;
    }
    else if (iVar5 < 0) {
LAB_0012fa43:
      fVar13 = FDB_RESULT_ITERATOR_FAIL;
      goto LAB_0012fa7a;
    }
  }
  iterator->_dhandle = local_100;
  iterator->_get_offset = local_140;
  fVar13 = FDB_RESULT_SUCCESS;
LAB_0012fa7a:
  if (fVar13 == FDB_RESULT_SUCCESS) {
    iterator->direction = '\x01';
  }
  else {
    iterator->_dhandle = (docio_handle *)0x0;
    if ((iterator->direction != '\0') &&
       (((iterator->seqtree_iterator != (btree_iterator *)0x0 ||
         (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (iterator->status == '\0')))) {
      iterator->_offset = 0xffffffffffffffff;
    }
  }
  paVar2 = &iterator->handle->handle_busy;
  LOCK();
  if ((paVar2->super___atomic_base<unsigned_char>)._M_i == '\x01') {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\0';
  }
  UNLOCK();
  LOCK();
  paVar1 = &iterator->handle->op_stats->num_iterator_moves;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return fVar13;
code_r0x0012f77a:
  if (iVar5 == 0) {
LAB_0012f77f:
    iterator->_dhandle = handle;
    iterator->_get_offset = local_150;
    fVar13 = FDB_RESULT_SUCCESS;
  }
LAB_0012f79d:
  if (fVar13 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0012fa7a;
  goto LAB_0012f2e1;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_next(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_next(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_next(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_FORWARD;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_NEXT);
    return result;
}